

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::LayoutBindingNegativeCase::iterate
          (LayoutBindingNegativeCase *this)

{
  bool bVar1;
  ShaderProgram *pSVar2;
  pointer ppSVar3;
  byte bVar4;
  string failMessage;
  char *local_38;
  undefined8 local_30;
  char local_28;
  undefined7 uStack_27;
  
  local_30 = 0;
  local_28 = '\0';
  local_38 = &local_28;
  if (this->m_errorType < ERRORTYPE_CONTRADICTORY) {
    pSVar2 = this->m_program;
    bVar1 = ((*pSVar2->m_shaders[0].
               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
               super__Vector_impl_data._M_start)->m_info).compileOk;
    if (this->m_tessSupport == true) {
      if (((bVar1 == false) ||
          (((*pSVar2->m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->m_info).compileOk != true)) ||
         (((*pSVar2->m_shaders[3].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
             _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk != true))
      goto LAB_0147c83c;
      ppSVar3 = pSVar2->m_shaders[4].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_start;
LAB_0147c82f:
      if (((*ppSVar3)->m_info).compileOk == false) goto LAB_0147c83c;
      bVar4 = 0;
    }
    else {
      if (bVar1 != false) {
        ppSVar3 = pSVar2->m_shaders[1].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        goto LAB_0147c82f;
      }
LAB_0147c83c:
      bVar4 = 1;
    }
    std::__cxx11::string::_M_replace((ulong)&local_38,0,(char *)0x0,0x1c8f401);
LAB_0147c858:
    if (bVar4 != 0) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      goto LAB_0147c883;
    }
  }
  else if (this->m_errorType == ERRORTYPE_CONTRADICTORY) {
    bVar1 = (this->m_program->m_program).m_info.linkOk;
    std::__cxx11::string::_M_replace((ulong)&local_38,0,(char *)0x0,0x1c8f3d8);
    bVar4 = bVar1 ^ 1;
    goto LAB_0147c858;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
             local_38);
LAB_0147c883:
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  return STOP;
}

Assistant:

TestCase::IterateResult LayoutBindingNegativeCase::iterate (void)
{
	bool pass = false;
	std::string failMessage;

	switch (m_errorType)
	{
		case ERRORTYPE_CONTRADICTORY:		// Contradictory binding points should cause a link-time error
			if (!(m_program->getProgramInfo()).linkOk)
				pass = true;
			failMessage = "Test failed - expected a link-time error";
			break;

		case ERRORTYPE_LESS_THAN_ZERO:		// Out of bounds binding points should cause a compile-time error
		case ERRORTYPE_OVER_MAX_UNITS:
			if (m_tessSupport)
			{
				if (!(m_program->getShaderInfo(glu::SHADERTYPE_VERTEX)).compileOk
					|| !(m_program->getShaderInfo(glu::SHADERTYPE_FRAGMENT).compileOk)
					|| !(m_program->getShaderInfo(glu::SHADERTYPE_TESSELLATION_CONTROL).compileOk)
					|| !(m_program->getShaderInfo(glu::SHADERTYPE_TESSELLATION_EVALUATION)).compileOk)
					pass = true;
			}
			else
			{
				if (!(m_program->getShaderInfo(glu::SHADERTYPE_VERTEX)).compileOk
					|| !(m_program->getShaderInfo(glu::SHADERTYPE_FRAGMENT).compileOk))
					pass = true;
			}

			failMessage = "Test failed - expected a compile-time error";
			break;

		default:
			DE_ASSERT(false);
	}

	if (pass)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, failMessage.c_str());

	return STOP;
}